

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Xcb.cpp
# Opt level: O2

void __thiscall tcu::x11::XcbWindow::~XcbWindow(XcbWindow *this)

{
  (this->super_WindowBase)._vptr_WindowBase = (_func_int **)&PTR__XcbWindow_003d5088;
  xcb_flush(this->m_display->m_connection);
  xcb_free_colormap(this->m_display->m_connection,this->m_colormap);
  xcb_destroy_window(this->m_display->m_connection,this->m_window);
  WindowBase::~WindowBase(&this->super_WindowBase);
  return;
}

Assistant:

XcbWindow::~XcbWindow (void)
{
	xcb_flush (m_display.getConnection());
	xcb_free_colormap(m_display.getConnection(), m_colormap);
	xcb_destroy_window(m_display.getConnection(), m_window);
}